

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

void __thiscall LowererMD::EmitSignExtend(LowererMD *this,Instr *instr)

{
  Opnd *dstOpnd;
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  Instr *instr_00;
  IRType type;
  OpCode opcode;
  
  dstOpnd = instr->m_dst;
  pOVar6 = instr->m_src1;
  pOVar1 = instr->m_src2;
  if ((pOVar6 == (Opnd *)0x0 || dstOpnd == (Opnd *)0x0) || pOVar1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1b7c,"(dst && src1 && src2)","dst && src1 && src2");
    if (!bVar3) goto LAB_0065ff6c;
    *puVar5 = 0;
  }
  type = pOVar1->m_type;
  iVar4 = TySize[type];
  if (TySize[dstOpnd->m_type] <= iVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1b7f,"(src2->GetSize() < dst->GetSize())",
                       "src2->GetSize() < dst->GetSize()");
    if (!bVar3) goto LAB_0065ff6c;
    *puVar5 = 0;
    type = pOVar1->m_type;
    iVar4 = TySize[type];
  }
  opcode = MOVSX;
  if (iVar4 != 1) {
    if (iVar4 == 4) {
      opcode = MOVSXD;
    }
    else if (iVar4 == 2) {
      opcode = MOVSXW;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1b8e,"((0))","UNREACHED");
      if (!bVar3) {
LAB_0065ff6c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      opcode = MOVSX;
    }
  }
  pOVar6 = IR::Opnd::UseWithNewType(pOVar6,type,this->m_func);
  instr_00 = IR::Instr::New(opcode,dstOpnd,pOVar6,this->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  Legalize<false>(instr->m_prev,false);
  return;
}

Assistant:

void LowererMD::EmitSignExtend(IR::Instr * instr)
{
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    Assert(dst && src1 && src2);

    // Src2 is used to determine what's the from type size
    Assert(src2->GetSize() < dst->GetSize());
    IRType fromType = src2->GetType();
    Js::OpCode op = Js::OpCode::MOVSX;
    switch (src2->GetSize())
    {
    case 1: break; // default
    case 2: op = Js::OpCode::MOVSXW; break;
    case 4:
#if _M_X64
        op = Js::OpCode::MOVSXD;
#else
        op = LowererMDArch::GetAssignOp(fromType);
#endif
        break;
    default:
        Assert(UNREACHED);
    }

#if _M_IX86
    // Special handling of int64 on x86
    if (dst->IsInt64())
    {
        Int64RegPair dstPair = m_func->FindOrCreateInt64Pair(dst);
        Int64RegPair srcPair = m_func->FindOrCreateInt64Pair(src1);

        IR::RegOpnd * eaxReg = IR::RegOpnd::New(RegEAX, TyInt32, m_func);
        IR::RegOpnd * edxReg = IR::RegOpnd::New(RegEDX, TyInt32, m_func);

        instr->InsertBefore(IR::Instr::New(op, eaxReg, srcPair.low->UseWithNewType(fromType, m_func), m_func));
        Legalize(instr->m_prev);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::CDQ, edxReg, m_func));
        Legalize(instr->m_prev);
        m_lowerer->InsertMove(dstPair.low, eaxReg, instr);
        m_lowerer->InsertMove(dstPair.high, edxReg, instr);
    }
    else
#endif
    {
        instr->InsertBefore(IR::Instr::New(op, dst, src1->UseWithNewType(fromType, m_func), m_func));
        Legalize(instr->m_prev);
    }
}